

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int delete_property(JSContext *ctx,JSObject *p,JSAtom atom)

{
  JSProperty *pJVar1;
  undefined8 *puVar2;
  byte bVar3;
  uint16_t uVar4;
  JSShape *pJVar5;
  list_head *plVar6;
  list_head *plVar7;
  JSRuntime *pJVar8;
  JSClassExoticMethods *pJVar9;
  _func_int_JSContext_ptr_JSValue_JSAtom *UNRECOVERED_JUMPTABLE;
  JSVarRef **ppJVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  JSObject *pJVar13;
  int64_t iVar14;
  JSContext *pJVar15;
  uint uVar16;
  BOOL BVar17;
  int iVar18;
  uint uVar19;
  void *__s;
  uint *puVar20;
  JSProperty *pJVar21;
  uint uVar22;
  JSShapeProperty *pJVar23;
  JSProperty *pJVar24;
  ulong uVar25;
  ulong uVar26;
  JSShape *pJVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  JSValue JVar31;
  JSValue v;
  JSShapeProperty *pr;
  JSObject *local_60;
  JSContext *local_58;
  uint32_t idx;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  while( true ) {
    pJVar5 = p->shape;
    uVar28 = ~(ulong)(pJVar5->prop_hash_mask & atom);
    pJVar27 = pJVar5 + 1;
    uVar16 = (&(pJVar5->header).ref_count)[uVar28];
    pJVar23 = (JSShapeProperty *)0x0;
    while (uVar16 != 0) {
      uVar29 = (ulong)uVar16;
      pr = (JSShapeProperty *)((long)pJVar27 + uVar29 * 8 + -8);
      if (*(JSAtom *)((long)pJVar27 + uVar29 * 8 + -4) == atom) {
        if ((*(uint *)pr >> 0x1a & 1) == 0) {
          return 0;
        }
        iVar18 = js_shape_prepare_update(ctx,p,&pr);
        if (iVar18 != 0) {
          return -1;
        }
        lVar30 = uVar29 - 1;
        pJVar5 = p->shape;
        if (pJVar23 == (JSShapeProperty *)0x0) {
          (&(pJVar5->header).ref_count)[uVar28] = *(uint *)pr & 0x3ffffff;
        }
        else {
          uVar28 = (ulong)((long)pJVar23 - (long)pJVar27) >> 3 & 0xffffffff;
          (&pJVar5[1].header.ref_count)[uVar28 * 2] =
               (&pJVar5[1].header.ref_count)[uVar28 * 2] & 0xfc000000U | *(uint *)pr & 0x3ffffff;
        }
        pJVar5->deleted_prop_count = pJVar5->deleted_prop_count + 1;
        pJVar21 = p->prop;
        local_60 = p;
        local_58 = ctx;
        free_property(ctx->rt,pJVar21 + lVar30,*(uint *)pr >> 0x1a);
        JS_FreeAtom(ctx,pr->atom);
        pJVar15 = local_58;
        *(uint *)pr = *(uint *)pr & 0x3ffffff;
        pr->atom = 0;
        *(undefined4 *)&pJVar21[lVar30].u = 0;
        pJVar21[lVar30].u.value.tag = 3;
        if (pJVar5->deleted_prop_count < 8) {
          return 1;
        }
        if ((uint)pJVar5->deleted_prop_count < (uint)pJVar5->prop_count >> 1) {
          return 1;
        }
        pJVar5 = local_60->shape;
        uVar22 = pJVar5->prop_count - pJVar5->deleted_prop_count;
        uVar16 = 2;
        if (2 < (int)uVar22) {
          uVar16 = uVar22;
        }
        uVar22 = pJVar5->prop_hash_mask + 1;
        do {
          uVar19 = uVar22;
          uVar28 = (ulong)uVar19;
          uVar22 = uVar19 >> 1;
        } while (uVar16 <= uVar19 >> 1);
        local_38 = uVar28 * 4;
        __s = js_malloc(local_58,local_38 + (ulong)uVar16 * 8 + 0x40);
        if (__s == (void *)0x0) {
          return 1;
        }
        pJVar27 = (JSShape *)((long)__s + uVar28 * 4);
        plVar6 = (pJVar5->header).link.prev;
        plVar7 = (pJVar5->header).link.next;
        plVar6->next = plVar7;
        plVar7->prev = plVar6;
        (pJVar5->header).link.prev = (list_head *)0x0;
        (pJVar5->header).link.next = (list_head *)0x0;
        uVar11 = *(undefined8 *)&pJVar5->prop_hash_mask;
        uVar12 = *(undefined8 *)&pJVar5->prop_count;
        pJVar13 = pJVar5->proto;
        puVar2 = (undefined8 *)((long)__s + uVar28 * 4 + 0x30);
        *puVar2 = pJVar5->shape_hash_next;
        puVar2[1] = pJVar13;
        puVar2 = (undefined8 *)((long)__s + uVar28 * 4 + 0x20);
        *puVar2 = uVar11;
        puVar2[1] = uVar12;
        uVar11 = *(undefined8 *)&pJVar5->header;
        plVar6 = (pJVar5->header).link.prev;
        uVar12 = *(undefined8 *)&pJVar5->is_hashed;
        puVar2 = (undefined8 *)((long)__s + uVar28 * 4 + 0x10);
        *puVar2 = (pJVar5->header).link.next;
        puVar2[1] = uVar12;
        puVar2 = (undefined8 *)((long)__s + uVar28 * 4);
        *puVar2 = uVar11;
        puVar2[1] = plVar6;
        plVar6 = (list_head *)((long)__s + uVar28 * 4 + 8);
        pJVar8 = pJVar15->rt;
        plVar7 = (pJVar8->gc_obj_list).prev;
        plVar7->next = plVar6;
        *(list_head **)((long)__s + uVar28 * 4 + 8) = plVar7;
        *(list_head **)((long)__s + uVar28 * 4 + 0x10) = &pJVar8->gc_obj_list;
        (pJVar8->gc_obj_list).prev = plVar6;
        local_48 = uVar28;
        local_40 = (ulong)uVar16;
        memset(__s,0,local_38);
        pJVar15 = local_58;
        pJVar13 = local_60;
        puVar20 = (uint *)((long)__s + local_48 * 4 + 0x40);
        pJVar21 = local_60->prop;
        pJVar24 = pJVar21;
        uVar28 = 0;
        for (uVar29 = 0; uVar29 < (uint)pJVar27->prop_count; uVar29 = uVar29 + 1) {
          uVar22 = *(uint *)(&pJVar5[1].header.field_0x4 + uVar29 * 8);
          uVar25 = uVar28;
          if (uVar22 != 0) {
            puVar20[1] = uVar22;
            uVar22 = (&pJVar5[1].header.ref_count)[uVar29 * 2] & 0xfc000000;
            *puVar20 = *puVar20 & 0x3ffffff | uVar22;
            uVar26 = ~(ulong)(*(uint *)(&pJVar5[1].header.field_0x4 + uVar29 * 8) & uVar19 - 1);
            *puVar20 = (&(pJVar27->header).ref_count)[uVar26] & 0x3ffffffU | uVar22;
            uVar22 = (int)uVar28 + 1;
            uVar25 = (ulong)uVar22;
            (&(pJVar27->header).ref_count)[uVar26] = uVar22;
            iVar14 = (pJVar24->u).value.tag;
            pJVar1 = pJVar21 + uVar28;
            (pJVar1->u).value.u = (pJVar24->u).value.u;
            (pJVar1->u).value.tag = iVar14;
            puVar20 = puVar20 + 2;
          }
          pJVar24 = pJVar24 + 1;
          uVar28 = uVar25;
        }
        pJVar27->prop_hash_mask = uVar19 - 1;
        pJVar27->prop_size = uVar16;
        pJVar27->deleted_prop_count = 0;
        pJVar27->prop_count = (int)uVar28;
        local_60->shape = pJVar27;
        (*(local_58->rt->mf).js_free)
                  (&local_58->rt->malloc_state,
                   &(pJVar5->header).ref_count + ~(ulong)pJVar5->prop_hash_mask);
        pJVar21 = (JSProperty *)js_realloc(pJVar15,pJVar13->prop,local_40 << 4);
        if (pJVar21 == (JSProperty *)0x0) {
          return 1;
        }
        pJVar13->prop = pJVar21;
        return 1;
      }
      pJVar23 = pr;
      uVar16 = *(uint *)pr & 0x3ffffff;
    }
    bVar3 = (p->field_0).header.dummy1;
    if ((bVar3 & 4) == 0) {
      return 1;
    }
    if ((bVar3 & 8) == 0) {
      pJVar9 = ctx->rt->class_array[(p->field_0).header.dummy2].exotic;
      if (pJVar9 == (JSClassExoticMethods *)0x0) {
        return 1;
      }
      UNRECOVERED_JUMPTABLE = pJVar9->delete_property;
      if (UNRECOVERED_JUMPTABLE != (_func_int_JSContext_ptr_JSValue_JSAtom *)0x0) {
        JVar31.tag = -1;
        JVar31.u.ptr = p;
        iVar18 = (*UNRECOVERED_JUMPTABLE)(ctx,JVar31,atom);
        return iVar18;
      }
      return 1;
    }
    BVar17 = JS_AtomIsArrayIndex(ctx,&idx,atom);
    if (BVar17 == 0) {
      return 1;
    }
    uVar16 = (p->u).array.count;
    if (uVar16 <= idx) break;
    uVar4 = (p->field_0).header.dummy2;
    if ((uVar4 != 8) && (uVar4 != 2)) {
      return 0;
    }
    if (idx == uVar16 - 1) {
      ppJVar10 = (p->u).func.var_refs;
      v.tag = (int64_t)ppJVar10[(ulong)idx * 2 + 1];
      v.u.ptr = ((JSValueUnion *)(ppJVar10 + (ulong)idx * 2))->ptr;
      JS_FreeValue(ctx,v);
      (p->u).array.count = idx;
      return 1;
    }
    iVar18 = convert_fast_array_to_array(ctx,p);
    if (iVar18 != 0) {
      return -1;
    }
  }
  return 1;
}

Assistant:

static int delete_property(JSContext *ctx, JSObject *p, JSAtom atom)
{
    JSShape *sh;
    JSShapeProperty *pr, *lpr, *prop;
    JSProperty *pr1;
    uint32_t lpr_idx;
    intptr_t h, h1;

 redo:
    sh = p->shape;
    h1 = atom & sh->prop_hash_mask;
    h = prop_hash_end(sh)[-h1 - 1];
    prop = get_shape_prop(sh);
    lpr = NULL;
    lpr_idx = 0;   /* prevent warning */
    while (h != 0) {
        pr = &prop[h - 1];
        if (likely(pr->atom == atom)) {
            /* found ! */
            if (!(pr->flags & JS_PROP_CONFIGURABLE))
                return FALSE;
            /* realloc the shape if needed */
            if (lpr)
                lpr_idx = lpr - get_shape_prop(sh);
            if (js_shape_prepare_update(ctx, p, &pr))
                return -1;
            sh = p->shape;
            /* remove property */
            if (lpr) {
                lpr = get_shape_prop(sh) + lpr_idx;
                lpr->hash_next = pr->hash_next;
            } else {
                prop_hash_end(sh)[-h1 - 1] = pr->hash_next;
            }
            sh->deleted_prop_count++;
            /* free the entry */
            pr1 = &p->prop[h - 1];
            free_property(ctx->rt, pr1, pr->flags);
            JS_FreeAtom(ctx, pr->atom);
            /* put default values */
            pr->flags = 0;
            pr->atom = JS_ATOM_NULL;
            pr1->u.value = JS_UNDEFINED;

            /* compact the properties if too many deleted properties */
            if (sh->deleted_prop_count >= 8 &&
                sh->deleted_prop_count >= ((unsigned)sh->prop_count / 2)) {
                compact_properties(ctx, p);
            }
            return TRUE;
        }
        lpr = pr;
        h = pr->hash_next;
    }

    if (p->is_exotic) {
        if (p->fast_array) {
            uint32_t idx;
            if (JS_AtomIsArrayIndex(ctx, &idx, atom) &&
                idx < p->u.array.count) {
                if (p->class_id == JS_CLASS_ARRAY ||
                    p->class_id == JS_CLASS_ARGUMENTS) {
                    /* Special case deleting the last element of a fast Array */
                    if (idx == p->u.array.count - 1) {
                        JS_FreeValue(ctx, p->u.array.u.values[idx]);
                        p->u.array.count = idx;
                        return TRUE;
                    }
                    if (convert_fast_array_to_array(ctx, p))
                        return -1;
                    goto redo;
                } else {
                    return FALSE;
                }
            }
        } else {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->delete_property) {
                return em->delete_property(ctx, JS_MKPTR(JS_TAG_OBJECT, p), atom);
            }
        }
    }
    /* not found */
    return TRUE;
}